

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O3

int arg_dbl_scanfn(arg_dbl *parent,char *argval)

{
  int iVar1;
  double dVar2;
  char *end;
  char *local_18;
  
  iVar1 = 2;
  if (parent->count != (parent->hdr).maxcount) {
    local_18 = (char *)0x2;
    if (argval == (char *)0x0) {
      parent->count = parent->count + 1;
    }
    else {
      dVar2 = strtod(argval,&local_18);
      if (*local_18 != '\0') {
        return 5;
      }
      iVar1 = parent->count;
      parent->count = iVar1 + 1;
      parent->dval[iVar1] = dVar2;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int arg_dbl_scanfn(struct arg_dbl * parent, const char * argval) {
	int errorcode = 0;

	if (parent->count == parent->hdr.maxcount) {
		/* maximum number of arguments exceeded */
		errorcode = EMAXCOUNT;
	} else if (!argval) {
		/* a valid argument with no argument value was given. */
		/* This happens when an optional argument value was invoked. */
		/* leave parent argument value unaltered but still count the argument. */
		parent->count++;
	} else {
		double val;
		char * end;

		/* extract double from argval into val */
		val = strtod(argval, &end);

		/* if success then store result in parent->dval[] array otherwise return error*/
		if (*end == 0) {
			parent->dval[parent->count++] = val;
		} else {
			errorcode = EBADDOUBLE;
		}
	}

	ARG_TRACE(("%s:scanfn(%p) returns %d\n", __FILE__, parent, errorcode));
	return errorcode;
}